

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<LargeNumbers>::populate
          (Generators<LargeNumbers> *this,LargeNumbers *val)

{
  GeneratorWrapper<LargeNumbers> local_20;
  LargeNumbers *local_18;
  LargeNumbers *val_local;
  Generators<LargeNumbers> *this_local;
  
  local_18 = val;
  val_local = (LargeNumbers *)this;
  value<LargeNumbers>((Generators *)&local_20,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<LargeNumbers>>
            ((vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>>>
              *)&this->m_generators,&local_20);
  GeneratorWrapper<LargeNumbers>::~GeneratorWrapper(&local_20);
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }